

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::jettisonnodes(tetgenmesh *this)

{
  verttype vVar1;
  bool bVar2;
  int local_24;
  int remcount;
  int newidx;
  int oldidx;
  bool jetflag;
  point pointloop;
  tetgenmesh *this_local;
  
  if (this->b->quiet == 0) {
    printf("Jettisoning redundant points.\n");
  }
  memorypool::traversalinit(this->points);
  _oldidx = pointtraverse(this);
  local_24 = 0;
  remcount = 0;
  while (_oldidx != (point)0x0) {
    vVar1 = pointtype(this,_oldidx);
    bVar2 = true;
    if (vVar1 != DUPLICATEDVERTEX) {
      vVar1 = pointtype(this,_oldidx);
      bVar2 = vVar1 == UNUSEDVERTEX;
    }
    if (bVar2) {
      pointdealloc(this,_oldidx);
    }
    else {
      setpointmark(this,_oldidx,local_24 + this->in->firstnumber);
      if ((this->in->pointmarkerlist != (int *)0x0) && (remcount < this->in->numberofpoints)) {
        this->in->pointmarkerlist[local_24] = this->in->pointmarkerlist[remcount];
      }
      local_24 = local_24 + 1;
    }
    remcount = remcount + 1;
    _oldidx = pointtraverse(this);
  }
  if (this->b->verbose != 0) {
    printf("  %ld duplicated vertices are removed.\n",this->dupverts);
    printf("  %ld unused vertices are removed.\n",this->unuverts);
  }
  this->dupverts = 0;
  this->unuverts = 0;
  this->points->deaditemstack = (void *)0x0;
  return;
}

Assistant:

void tetgenmesh::jettisonnodes()
{
  point pointloop;
  bool jetflag;
  int oldidx, newidx;
  int remcount;

  if (!b->quiet) {
    printf("Jettisoning redundant points.\n");
  }

  points->traversalinit();
  pointloop = pointtraverse();
  oldidx = newidx = 0; // in->firstnumber;
  remcount = 0;
  while (pointloop != (point) NULL) {
    jetflag = (pointtype(pointloop) == DUPLICATEDVERTEX) || 
      (pointtype(pointloop) == UNUSEDVERTEX);
    if (jetflag) {
      // It is a duplicated or unused point, delete it.
      pointdealloc(pointloop);
      remcount++;
    } else {
      // Re-index it.
      setpointmark(pointloop, newidx + in->firstnumber);
      if (in->pointmarkerlist != (int *) NULL) {
        if (oldidx < in->numberofpoints) {
          // Re-index the point marker as well.
          in->pointmarkerlist[newidx] = in->pointmarkerlist[oldidx];
        }
      }
      newidx++;
    }
    oldidx++;
    pointloop = pointtraverse();
  }
  if (b->verbose) {
    printf("  %ld duplicated vertices are removed.\n", dupverts);
    printf("  %ld unused vertices are removed.\n", unuverts);
  }
  dupverts = 0l;
  unuverts = 0l;

  // The following line ensures that dead items in the pool of nodes cannot
  //   be allocated for the new created nodes. This ensures that the input
  //   nodes will occur earlier in the output files, and have lower indices.
  points->deaditemstack = (void *) NULL;
}